

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O2

int32_t __thiscall
icu_63::ThaiBreakEngine::divideUpDictionaryRange
          (ThaiBreakEngine *this,UText *text,int32_t rangeStart,int32_t rangeEnd,
          UVector32 *foundBreaks)

{
  bool bVar1;
  ulong uVar2;
  UBool UVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  UChar32 c;
  UChar32 UVar7;
  int64_t iVar8;
  long lVar9;
  int64_t iVar10;
  uint uVar11;
  long index;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  PossibleWord *this_00;
  UnicodeSet *this_01;
  int local_2b0;
  UErrorCode status;
  int64_t local_298;
  UnicodeSet *local_290;
  UVector32 *local_288;
  UnicodeSet *local_280;
  PossibleWord *local_278;
  ulong local_270;
  UnicodeSet *local_268 [2];
  PossibleWord words [3];
  
  index = (long)rangeStart;
  local_288 = foundBreaks;
  utext_setNativeIndex_63(text,index);
  utext_moveIndex32_63(text,4);
  iVar8 = utext_getNativeIndex_63(text);
  iVar4 = 0;
  if (iVar8 < rangeEnd) {
    utext_setNativeIndex_63(text,index);
    status = U_ZERO_ERROR;
    lVar9 = 0x10;
    do {
      *(undefined8 *)((long)local_268 + lVar9) = 0;
      *(undefined8 *)((long)words[0].cuLengths + lVar9 + -0x1c) = 0xffffffff;
      *(undefined4 *)((long)words[0].cuLengths + lVar9 + -0x14) = 0;
      lVar9 = lVar9 + 0xb4;
    } while (lVar9 != 0x22c);
    utext_setNativeIndex_63(text,index);
    local_268[1] = &this->fEndWordSet;
    local_268[0] = &this->fBeginWordSet;
    local_280 = &this->fMarkSet;
    local_290 = &this->fSuffixSet;
    uVar14 = 0;
LAB_002c919c:
    if ((status < U_ILLEGAL_ARGUMENT_ERROR) &&
       (local_298 = utext_getNativeIndex_63(text), (int)local_298 < rangeEnd)) {
      uVar2 = (ulong)uVar14 % 3;
      this_00 = words + uVar2;
      iVar4 = PossibleWord::candidates(this_00,text,this->fDictionary,rangeEnd);
      if (iVar4 == 1) {
LAB_002c91f8:
        iVar4 = PossibleWord::acceptMarked(this_00,text);
        uVar14 = uVar14 + 1;
        bVar1 = words[uVar2].cpLengths[words[uVar2].mark] < 3;
      }
      else {
        if (1 < iVar4) {
          iVar8 = utext_getNativeIndex_63(text);
          if ((int)iVar8 < rangeEnd) {
            do {
              iVar4 = PossibleWord::candidates
                                (words + (ulong)(uVar14 + 1) % 3,text,this->fDictionary,rangeEnd);
              if (0 < iVar4) {
                words[uVar2].mark = words[uVar2].current;
                iVar8 = utext_getNativeIndex_63(text);
                if (rangeEnd <= (int)iVar8) break;
                do {
                  iVar4 = PossibleWord::candidates
                                    (words + (ulong)(uVar14 + 2) % 3,text,this->fDictionary,rangeEnd
                                    );
                  if (iVar4 != 0) {
                    words[uVar2].mark = words[uVar2].current;
                    goto LAB_002c91f8;
                  }
                  UVar3 = PossibleWord::backUp(words + (ulong)(uVar14 + 1) % 3,text);
                } while (UVar3 != '\0');
              }
              UVar3 = PossibleWord::backUp(this_00,text);
            } while (UVar3 != '\0');
          }
          goto LAB_002c91f8;
        }
        bVar1 = true;
        iVar4 = 0;
      }
      iVar8 = utext_getNativeIndex_63(text);
      this_01 = local_280;
      if ((bVar1) && ((int)iVar8 < rangeEnd)) {
        iVar5 = PossibleWord::candidates(words + (ulong)uVar14 % 3,text,this->fDictionary,rangeEnd);
        if ((iVar5 < 1) && ((iVar4 == 0 || (words[(ulong)uVar14 % 3].prefix < 3)))) {
          uVar11 = iVar4 + (int)local_298;
          local_270 = (ulong)uVar11;
          iVar15 = 0;
          local_278 = words + (ulong)(uVar14 + 1) % 3;
          iVar12 = rangeEnd - uVar11;
          do {
            do {
              iVar8 = utext_getNativeIndex_63(text);
              UVar7 = utext_next32_63(text);
              iVar10 = utext_getNativeIndex_63(text);
              iVar6 = (int)iVar10 - (int)iVar8;
              iVar15 = iVar15 + iVar6;
              iVar13 = iVar12 - iVar6;
              if (iVar13 == 0 || iVar12 < iVar6) goto LAB_002c9425;
              c = utext_current32_63(text);
              UVar3 = UnicodeSet::contains(local_268[1],UVar7);
              iVar12 = iVar13;
            } while ((UVar3 == '\0') ||
                    (UVar3 = UnicodeSet::contains(local_268[0],c), UVar3 == '\0'));
            iVar5 = PossibleWord::candidates(local_278,text,this->fDictionary,rangeEnd);
            utext_setNativeIndex_63(text,(long)((int)local_270 + iVar15));
          } while (iVar5 < 1);
LAB_002c9425:
          uVar14 = uVar14 + (iVar4 < 1);
          iVar4 = iVar15 + iVar4;
          this_01 = local_280;
        }
        else {
          utext_setNativeIndex_63(text,(long)((int)local_298 + iVar4));
        }
      }
      while( true ) {
        iVar8 = utext_getNativeIndex_63(text);
        if (rangeEnd <= (int)iVar8) break;
        UVar7 = utext_current32_63(text);
        UVar3 = UnicodeSet::contains(this_01,UVar7);
        if (UVar3 == '\0') break;
        utext_next32_63(text);
        iVar10 = utext_getNativeIndex_63(text);
        iVar4 = (iVar4 - (int)iVar8) + (int)iVar10;
      }
      iVar8 = utext_getNativeIndex_63(text);
      if ((rangeEnd <= (int)iVar8) || (iVar4 < 1)) goto LAB_002c95a3;
      iVar5 = PossibleWord::candidates(words + (ulong)uVar14 % 3,text,this->fDictionary,rangeEnd);
      if (iVar5 < 1) {
        UVar7 = utext_current32_63(text);
        UVar3 = UnicodeSet::contains(local_290,UVar7);
        if (UVar3 == '\0') goto LAB_002c94cd;
        if (UVar7 != 0xe2f) {
LAB_002c955e:
          if (UVar7 == 0xe46) {
            UVar7 = utext_previous32_63(text);
            utext_next32_63(text);
            if (UVar7 != 0xe46) {
              iVar8 = utext_getNativeIndex_63(text);
              utext_next32_63(text);
              iVar10 = utext_getNativeIndex_63(text);
              iVar4 = (iVar4 - (int)iVar8) + (int)iVar10;
            }
          }
          goto LAB_002c95a3;
        }
        UVar7 = utext_previous32_63(text);
        UVar3 = UnicodeSet::contains(local_290,UVar7);
        utext_next32_63(text);
        if (UVar3 == '\0') {
          iVar8 = utext_getNativeIndex_63(text);
          utext_next32_63(text);
          iVar10 = utext_getNativeIndex_63(text);
          UVar7 = utext_current32_63(text);
          local_2b0 = (int)iVar8;
          iVar4 = (iVar4 - local_2b0) + (int)iVar10;
          goto LAB_002c955e;
        }
      }
      else {
LAB_002c94cd:
        utext_setNativeIndex_63(text,(long)((int)local_298 + iVar4));
      }
      goto LAB_002c95ab;
    }
    iVar12 = local_288->count;
    if ((long)iVar12 < 1) {
      if (0 < rangeEnd) {
        return uVar14;
      }
    }
    else {
      if (local_288->elements[(long)iVar12 + -1] < rangeEnd) {
        return uVar14;
      }
      local_288->count = iVar12 + -1;
    }
    iVar4 = uVar14 - 1;
  }
  return iVar4;
LAB_002c95a3:
  if (0 < iVar4) {
LAB_002c95ab:
    UVector32::addElement(local_288,iVar4 + (int)local_298,&status);
  }
  goto LAB_002c919c;
}

Assistant:

int32_t
ThaiBreakEngine::divideUpDictionaryRange( UText *text,
                                                int32_t rangeStart,
                                                int32_t rangeEnd,
                                                UVector32 &foundBreaks ) const {
    utext_setNativeIndex(text, rangeStart);
    utext_moveIndex32(text, THAI_MIN_WORD_SPAN);
    if (utext_getNativeIndex(text) >= rangeEnd) {
        return 0;       // Not enough characters for two words
    }
    utext_setNativeIndex(text, rangeStart);


    uint32_t wordsFound = 0;
    int32_t cpWordLength = 0;    // Word Length in Code Points.
    int32_t cuWordLength = 0;    // Word length in code units (UText native indexing)
    int32_t current;
    UErrorCode status = U_ZERO_ERROR;
    PossibleWord words[THAI_LOOKAHEAD];
    
    utext_setNativeIndex(text, rangeStart);
    
    while (U_SUCCESS(status) && (current = (int32_t)utext_getNativeIndex(text)) < rangeEnd) {
        cpWordLength = 0;
        cuWordLength = 0;

        // Look for candidate words at the current position
        int32_t candidates = words[wordsFound%THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);
        
        // If we found exactly one, use that
        if (candidates == 1) {
            cuWordLength = words[wordsFound % THAI_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % THAI_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }
        // If there was more than one, see which one can take us forward the most words
        else if (candidates > 1) {
            // If we're already at the end of the range, we're done
            if ((int32_t)utext_getNativeIndex(text) >= rangeEnd) {
                goto foundBest;
            }
            do {
                int32_t wordsMatched = 1;
                if (words[(wordsFound + 1) % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) > 0) {
                    if (wordsMatched < 2) {
                        // Followed by another dictionary word; mark first word as a good candidate
                        words[wordsFound%THAI_LOOKAHEAD].markCurrent();
                        wordsMatched = 2;
                    }
                    
                    // If we're already at the end of the range, we're done
                    if ((int32_t)utext_getNativeIndex(text) >= rangeEnd) {
                        goto foundBest;
                    }
                    
                    // See if any of the possible second words is followed by a third word
                    do {
                        // If we find a third word, stop right away
                        if (words[(wordsFound + 2) % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd)) {
                            words[wordsFound % THAI_LOOKAHEAD].markCurrent();
                            goto foundBest;
                        }
                    }
                    while (words[(wordsFound + 1) % THAI_LOOKAHEAD].backUp(text));
                }
            }
            while (words[wordsFound % THAI_LOOKAHEAD].backUp(text));
foundBest:
            // Set UText position to after the accepted word.
            cuWordLength = words[wordsFound % THAI_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % THAI_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }
        
        // We come here after having either found a word or not. We look ahead to the
        // next word. If it's not a dictionary word, we will combine it with the word we
        // just found (if there is one), but only if the preceding word does not exceed
        // the threshold.
        // The text iterator should now be positioned at the end of the word we found.
        
        UChar32 uc = 0;
        if ((int32_t)utext_getNativeIndex(text) < rangeEnd &&  cpWordLength < THAI_ROOT_COMBINE_THRESHOLD) {
            // if it is a dictionary word, do nothing. If it isn't, then if there is
            // no preceding word, or the non-word shares less than the minimum threshold
            // of characters with a dictionary word, then scan to resynchronize
            if (words[wordsFound % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) <= 0
                  && (cuWordLength == 0
                      || words[wordsFound%THAI_LOOKAHEAD].longestPrefix() < THAI_PREFIX_COMBINE_THRESHOLD)) {
                // Look for a plausible word boundary
                int32_t remaining = rangeEnd - (current+cuWordLength);
                UChar32 pc;
                int32_t chars = 0;
                for (;;) {
                    int32_t pcIndex = (int32_t)utext_getNativeIndex(text);
                    pc = utext_next32(text);
                    int32_t pcSize = (int32_t)utext_getNativeIndex(text) - pcIndex;
                    chars += pcSize;
                    remaining -= pcSize;
                    if (remaining <= 0) {
                        break;
                    }
                    uc = utext_current32(text);
                    if (fEndWordSet.contains(pc) && fBeginWordSet.contains(uc)) {
                        // Maybe. See if it's in the dictionary.
                        // NOTE: In the original Apple code, checked that the next
                        // two characters after uc were not 0x0E4C THANTHAKHAT before
                        // checking the dictionary. That is just a performance filter,
                        // but it's not clear it's faster than checking the trie.
                        int32_t num_candidates = words[(wordsFound + 1) % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);
                        utext_setNativeIndex(text, current + cuWordLength + chars);
                        if (num_candidates > 0) {
                            break;
                        }
                    }
                }
                
                // Bump the word count if there wasn't already one
                if (cuWordLength <= 0) {
                    wordsFound += 1;
                }
                
                // Update the length with the passed-over characters
                cuWordLength += chars;
            }
            else {
                // Back up to where we were for next iteration
                utext_setNativeIndex(text, current+cuWordLength);
            }
        }
        
        // Never stop before a combining mark.
        int32_t currPos;
        while ((currPos = (int32_t)utext_getNativeIndex(text)) < rangeEnd && fMarkSet.contains(utext_current32(text))) {
            utext_next32(text);
            cuWordLength += (int32_t)utext_getNativeIndex(text) - currPos;
        }
        
        // Look ahead for possible suffixes if a dictionary word does not follow.
        // We do this in code rather than using a rule so that the heuristic
        // resynch continues to function. For example, one of the suffix characters
        // could be a typo in the middle of a word.
        if ((int32_t)utext_getNativeIndex(text) < rangeEnd && cuWordLength > 0) {
            if (words[wordsFound%THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) <= 0
                && fSuffixSet.contains(uc = utext_current32(text))) {
                if (uc == THAI_PAIYANNOI) {
                    if (!fSuffixSet.contains(utext_previous32(text))) {
                        // Skip over previous end and PAIYANNOI
                        utext_next32(text);
                        int32_t paiyannoiIndex = (int32_t)utext_getNativeIndex(text);
                        utext_next32(text);
                        cuWordLength += (int32_t)utext_getNativeIndex(text) - paiyannoiIndex;    // Add PAIYANNOI to word
                        uc = utext_current32(text);     // Fetch next character
                    }
                    else {
                        // Restore prior position
                        utext_next32(text);
                    }
                }
                if (uc == THAI_MAIYAMOK) {
                    if (utext_previous32(text) != THAI_MAIYAMOK) {
                        // Skip over previous end and MAIYAMOK
                        utext_next32(text);
                        int32_t maiyamokIndex = (int32_t)utext_getNativeIndex(text);
                        utext_next32(text);
                        cuWordLength += (int32_t)utext_getNativeIndex(text) - maiyamokIndex;    // Add MAIYAMOK to word
                    }
                    else {
                        // Restore prior position
                        utext_next32(text);
                    }
                }
            }
            else {
                utext_setNativeIndex(text, current+cuWordLength);
            }
        }

        // Did we find a word on this iteration? If so, push it on the break stack
        if (cuWordLength > 0) {
            foundBreaks.push((current+cuWordLength), status);
        }
    }

    // Don't return a break for the end of the dictionary range if there is one there.
    if (foundBreaks.peeki() >= rangeEnd) {
        (void) foundBreaks.popi();
        wordsFound -= 1;
    }

    return wordsFound;
}